

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_partition::load_1(xr_partition *this,xr_reader *r)

{
  uint32_t uVar1;
  xr_reader *r_local;
  xr_partition *this_local;
  
  xr_reader::r_sz(r,&this->m_name);
  uVar1 = xr_reader::r_u32(r);
  xr_reader::
  r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
            (r,uVar1,&this->m_bones);
  return;
}

Assistant:

void xr_partition::load_1(xr_reader& r)
{
	r.r_sz(m_name);
	r.r_seq(r.r_u32(), m_bones, xr_reader::f_r_sz());
}